

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControllerBlogPost.cpp
# Opt level: O0

string * __thiscall
Angelsen::ControllerBlogPost::get
          (string *__return_storage_ptr__,ControllerBlogPost *this,string *blogPath)

{
  pointer this_00;
  string *psVar1;
  string local_178;
  allocator<char> local_151;
  string local_150;
  string local_130;
  undefined1 local_110 [8];
  Template t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  WebFile blog;
  string *blogPath_local;
  ControllerBlogPost *this_local;
  
  blog.file_.field_2._8_8_ = blogPath;
  std::operator+(&local_a8,&this->config_->templateDir,"/");
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 blog.file_.field_2._8_8_);
  EasyWeb::WebFile::WebFile((WebFile *)local_68,&local_88,false);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  this_00 = std::unique_ptr<EasyWeb::WebFile,_std::default_delete<EasyWeb::WebFile>_>::operator->
                      (&this->config_->template_);
  psVar1 = EasyWeb::WebFile::file_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)&local_130,(string *)psVar1);
  Jinja2CppLight::Template::Template((Template *)local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"body",&local_151);
  psVar1 = EasyWeb::WebFile::file_abi_cxx11_((WebFile *)local_68);
  std::__cxx11::string::string((string *)&local_178,(string *)psVar1);
  Jinja2CppLight::Template::setValue((Template *)local_110,&local_150,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  Jinja2CppLight::Template::render_abi_cxx11_(__return_storage_ptr__,(Template *)local_110);
  Jinja2CppLight::Template::~Template((Template *)local_110);
  EasyWeb::WebFile::~WebFile((WebFile *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string ControllerBlogPost::get(const std::string& blogPath)
{
    EasyWeb::WebFile blog(config_.templateDir + "/" + blogPath, false);

    Jinja2CppLight::Template t(config_.template_->file());
    t.setValue("body", blog.file());

    return t.render();
}